

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed64
          (UnknownFieldLiteParserHelper *this,uint32 num,uint64 value)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char buffer [8];
  uint64 local_30;
  
  if (this->unknown_ != (string *)0x0) {
    uVar3 = (ulong)(num * 8 + 1);
    cVar2 = (char)this->unknown_;
    if (0x7f < num << 3) {
      do {
        std::__cxx11::string::push_back(cVar2);
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar3 >> 7;
      } while (bVar1);
    }
    std::__cxx11::string::push_back(cVar2);
    local_30 = value;
    std::__cxx11::string::append((char *)this->unknown_,(ulong)&local_30);
  }
  return;
}

Assistant:

void AddFixed64(uint32 num, uint64 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 1, unknown_);
    char buffer[8];
    io::CodedOutputStream::WriteLittleEndian64ToArray(
        value, reinterpret_cast<uint8*>(buffer));
    unknown_->append(buffer, 8);
  }